

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall dgMeshEffect::AddPoint(dgMeshEffect *this,HaF64 *vertex,HaI32 material)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [32];
  dgVertexAtribute local_80;
  
  auVar1 = *(undefined1 (*) [32])vertex;
  uVar2 = vcmppd_avx512vl(ZEXT816(0) << 0x40,*(undefined1 (*) [16])(vertex + 2),3);
  local_80.m_vertex.super_dgTemplateVector<double>.m_x = (double)auVar1._0_8_;
  local_80.m_vertex.super_dgTemplateVector<double>.m_y = (double)auVar1._8_8_;
  local_80.m_vertex.super_dgTemplateVector<double>.m_z = (double)auVar1._16_8_;
  local_80.m_vertex.super_dgTemplateVector<double>.m_w = (double)auVar1._24_8_;
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar4._16_8_ = 0x7fffffffffffffff;
  auVar4._24_8_ = 0x7fffffffffffffff;
  auVar4 = vpandq_avx512vl(auVar1,auVar4);
  auVar1._8_8_ = 0x7fefffffffffffff;
  auVar1._0_8_ = 0x7fefffffffffffff;
  auVar1._16_8_ = 0x7fefffffffffffff;
  auVar1._24_8_ = 0x7fefffffffffffff;
  uVar3 = vpcmpgtq_avx512vl(auVar4,auVar1);
  if (((((uVar3 & 0xf) == 0) && (!NAN((double)vertex[1]))) && ((uVar2 & 1) == 0)) &&
     ((uVar2 & 3) >> 1 == 0)) {
    AddVertex(this,&local_80.m_vertex);
    local_80._0_64_ =
         vinsertf64x4_avx512f
                   (ZEXT3264((undefined1  [32])
                             this->m_points
                             [(long)*(int *)&(this->super_dgRefCounter).field_0xc + -1].
                             super_dgTemplateVector<double>),*(undefined1 (*) [32])(vertex + 2),1);
    local_80.m_v0 = vertex[8];
    local_80.m_u1 = vertex[9];
    local_80.m_v1 = vertex[10];
    local_80.m_material = (HaF64)(double)material;
    AddAtribute(this,&local_80);
    return;
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x159,
                "dgBigVector::dgBigVector(hacd::HaF64, hacd::HaF64, hacd::HaF64, hacd::HaF64)");
}

Assistant:

void dgMeshEffect::AddPoint(const hacd::HaF64* vertex, hacd::HaI32 material)
{
	dgVertexAtribute attib;
	AddVertex(dgBigVector (vertex[0], vertex[1], vertex[2], vertex[3]));
	
	attib.m_vertex.m_x = m_points[m_pointCount - 1].m_x;
	attib.m_vertex.m_y = m_points[m_pointCount - 1].m_y;
	attib.m_vertex.m_z = m_points[m_pointCount - 1].m_z;
	attib.m_vertex.m_w = m_points[m_pointCount - 1].m_w;

	attib.m_normal_x = vertex[4];
	attib.m_normal_y = vertex[5];
	attib.m_normal_z = vertex[6];
	attib.m_u0 = vertex[7];
	attib.m_v0 = vertex[8];
	attib.m_u1 = vertex[9];
	attib.m_v1 = vertex[10];
	attib.m_material = material;

	AddAtribute (attib);
}